

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O2

err_t btokCVCUnwrap(btok_cvc_t *cvc,octet *cert,size_t cert_len,octet *pubkey,size_t pubkey_len)

{
  bool bVar1;
  bool bVar2;
  bool_t bVar3;
  err_t eVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  octet *poVar9;
  octet *poVar10;
  octet *poVar11;
  char *oid;
  octet *der;
  ulong uVar12;
  octet *local_268;
  ulong local_248;
  octet *local_240;
  der_anchor_t CertHAT [1];
  der_anchor_t PubKey [1];
  der_anchor_t CVCert [1];
  der_anchor_t DDT [1];
  der_anchor_t CVExt [1];
  der_anchor_t CertBody [1];
  
  bVar3 = memIsValid(cvc,0x128);
  if (bVar3 == 0) {
    return 0x6d;
  }
  if (8 < (pubkey_len << 0x3c | pubkey_len >> 4)) {
    return 0x6d;
  }
  if ((0x159UL >> (pubkey_len >> 4 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  poVar9 = cvc->pubkey;
  if ((pubkey != (octet *)0x0 && pubkey_len == 0) && poVar9 != pubkey) {
    return 0x6d;
  }
  bVar3 = memIsValid(cert,cert_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsValid(pubkey,pubkey_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsDisjoint2(cvc,0x128,cert,cert_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsDisjoint2(cvc,0x128,pubkey,pubkey_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  memSet(cvc,'\0',0x128);
  sVar5 = derTSEQDecStart(CVCert,cert,cert_len,0x7f21);
  if (sVar5 == 0xffffffffffffffff) {
    return 0x132;
  }
  der = cert + sVar5;
  if (cert == (octet *)0x0) {
    der = (octet *)0x0;
  }
  sVar5 = cert_len - sVar5;
  memSet(cvc,'\0',0x128);
  sVar6 = derTSEQDecStart(CertBody,der,sVar5,0x7f4e);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  sVar7 = derTSIZEDec2(der + sVar6,sVar5 - sVar6,0x5f29,0);
  if (sVar7 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = der + sVar6 + sVar7;
  sVar7 = (sVar5 - sVar6) - sVar7;
  sVar6 = derTPSTRDec((char *)0x0,&local_248,poVar11,sVar7,0x42);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  if (local_248 - 0xd < 0xfffffffffffffffb) {
    return 0x132;
  }
  sVar6 = derTPSTRDec(cvc->authority,(size_t *)0x0,poVar11,sVar7,0x42);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + sVar6;
  sVar8 = derTSEQDecStart(PubKey,poVar11,sVar7 - sVar6,0x7f49);
  if (sVar8 == 0xffffffffffffffff) {
    return 0x132;
  }
  sVar7 = (sVar7 - sVar6) - sVar8;
  sVar6 = derOIDDec2(poVar11 + sVar8,sVar7,"1.2.112.0.2.0.34.101.45.2.1");
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + sVar8 + sVar6;
  sVar7 = sVar7 - sVar6;
  sVar6 = derTBITDec((octet *)0x0,&local_248,poVar11,sVar7,3);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  uVar12 = local_248 - 0x180 >> 7;
  if (5 < (local_248 << 0x39 | uVar12)) {
    return 0x132;
  }
  if ((0x2bUL >> (uVar12 & 0x3f) & 1) == 0) {
    return 0x132;
  }
  cvc->pubkey_len = local_248 >> 3;
  sVar6 = derTBITDec(poVar9,(size_t *)0x0,poVar11,sVar7,3);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  sVar8 = derTSEQDecStop(poVar11 + sVar6,PubKey);
  if (sVar8 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + sVar6 + sVar8;
  sVar7 = sVar7 - (sVar6 + sVar8);
  sVar6 = derTPSTRDec((char *)0x0,&local_248,poVar11,sVar7,0x5f20);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  if (local_248 - 0xd < 0xfffffffffffffffb) {
    return 0x132;
  }
  sVar6 = derTPSTRDec(cvc->holder,(size_t *)0x0,poVar11,sVar7,0x5f20);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + sVar6;
  sVar7 = sVar7 - sVar6;
  bVar3 = derStartsWith(poVar11,sVar7,0x7f4c);
  if (bVar3 != 0) {
    sVar6 = derTSEQDecStart(CertHAT,poVar11,sVar7,0x7f4c);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6;
    sVar8 = derOIDDec2(poVar11,sVar7 - sVar6,"1.2.112.0.2.0.34.101.79.6.1");
    if (sVar8 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar7 = (sVar7 - sVar6) - sVar8;
    poVar11 = poVar11 + sVar8;
    sVar6 = derTOCTDec2(cvc->hat_eid,poVar11,sVar7,4,5);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar8 = derTSEQDecStop(poVar11 + sVar6,CertHAT);
    if (sVar8 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6 + sVar8;
    sVar7 = sVar7 - (sVar6 + sVar8);
  }
  sVar6 = derTOCTDec2(cvc->from,poVar11,sVar7,0x5f25,6);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  sVar8 = derTOCTDec2(cvc->until,poVar11 + sVar6,sVar7 - sVar6,0x5f24,6);
  if (sVar8 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + sVar6 + sVar8;
  sVar8 = (sVar7 - sVar6) - sVar8;
  bVar3 = derStartsWith(poVar11,sVar8,0x65);
  if (bVar3 != 0) {
    sVar6 = derTSEQDecStart(CVExt,poVar11,sVar8,0x65);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6;
    sVar7 = derTSEQDecStart(DDT,poVar11,sVar8 - sVar6,0x73);
    if (sVar7 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar8 = (sVar8 - sVar6) - sVar7;
    poVar11 = poVar11 + sVar7;
    sVar6 = derOIDDec2(poVar11,sVar8,"1.2.112.0.2.0.34.101.79.8.1");
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar8 = sVar8 - sVar6;
    poVar11 = poVar11 + sVar6;
    sVar6 = derTSEQDecStart(CertHAT,poVar11,sVar8,0x7f4c);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar8 = sVar8 - sVar6;
    poVar11 = poVar11 + sVar6;
    sVar6 = derOIDDec2(poVar11,sVar8,"1.2.112.0.2.0.34.101.79.6.2");
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6;
    sVar6 = derTOCTDec2(cvc->hat_esign,poVar11,sVar8 - sVar6,4,2);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6;
    sVar6 = derTSEQDecStop(poVar11,CertHAT);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6;
    sVar6 = derTSEQDecStop(poVar11,DDT);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x132;
    }
    sVar7 = derTSEQDecStop(poVar11 + sVar6,CVExt);
    if (sVar7 == 0xffffffffffffffff) {
      return 0x132;
    }
    poVar11 = poVar11 + sVar6 + sVar7;
  }
  sVar6 = derTSEQDecStop(poVar11,CertBody);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar11 = poVar11 + (sVar6 - (long)der);
  if (poVar11 == (octet *)0xffffffffffffffff) {
    return 0x132;
  }
  poVar10 = der + (long)poVar11;
  if (der == (octet *)0x0) {
    poVar10 = (octet *)0x0;
  }
  sVar5 = sVar5 - (long)poVar11;
  if ((pubkey_len == 0) && ((poVar9 != pubkey || (pubkey_len = cvc->pubkey_len, pubkey_len == 0))))
  {
    pubkey_len = 0;
    sVar6 = 0x22;
    sVar7 = derDec3((octet **)0x0,poVar10,sVar5,0x5f37,0x22);
    bVar2 = true;
    bVar1 = true;
    if (sVar7 == 0xffffffffffffffff) {
      pubkey_len = 0;
      sVar6 = 0x30;
      sVar7 = derDec3((octet **)0x0,poVar10,sVar5,0x5f37,0x30);
      bVar1 = bVar2;
      if (sVar7 == 0xffffffffffffffff) {
        pubkey_len = 0;
        sVar6 = 0x48;
        sVar7 = derDec3((octet **)0x0,poVar10,sVar5,0x5f37,0x48);
        if (sVar7 == 0xffffffffffffffff) {
          pubkey_len = 0;
          sVar6 = 0x60;
          sVar7 = derDec3((octet **)0x0,poVar10,sVar5,0x5f37,0x60);
          if (sVar7 == 0xffffffffffffffff) {
            return 0x132;
          }
        }
      }
    }
  }
  else {
    sVar6 = 0x22;
    if (pubkey_len != 0x30) {
      sVar6 = pubkey_len - (pubkey_len >> 2);
    }
    bVar1 = false;
  }
  cvc->sig_len = sVar6;
  local_240 = cvc->sig;
  sVar6 = derTOCTDec2(local_240,poVar10,sVar5,0x5f37,sVar6);
  if (sVar6 == 0xffffffffffffffff) {
    return 0x132;
  }
  poVar9 = poVar10 + sVar6;
  if (poVar10 == (octet *)0x0) {
    poVar9 = (octet *)0x0;
  }
  if (bVar1) goto LAB_0013bb6e;
  CertHAT[0].der = (octet *)0x10;
  if ((pubkey_len & 1) != 0) {
    return 0x6d;
  }
  uVar12 = pubkey_len >> 1;
  btokParamsStd((bign_params *)CertBody,uVar12);
  if (pubkey_len < 0x41) {
    sVar7 = beltHash_keep();
  }
  else {
    sVar7 = bashHash_keep();
  }
  poVar10 = (octet *)blobCreate(sVar7 + uVar12);
  if (poVar10 == (octet *)0x0) {
    return 0x6e;
  }
  local_268 = poVar10 + uVar12;
  if (pubkey_len < 0x41) {
    beltHashStart(local_268);
    beltHashStepH(der,(size_t)poVar11,local_268);
    beltHashStepG2(poVar10,uVar12,local_268);
    eVar4 = bignOidToDER((octet *)PubKey,(size_t *)CertHAT,"1.2.112.0.2.0.34.101.31.81");
    if (eVar4 == 0) {
      if (pubkey_len != 0x30) goto LAB_0013bd3d;
      eVar4 = bign96PubkeyVal((bign_params *)CertBody,pubkey);
      local_268 = poVar10;
      if (eVar4 == 0) {
        eVar4 = bign96Verify((bign_params *)CertBody,(octet *)PubKey,(size_t)CertHAT[0].der,poVar10,
                             local_240,pubkey);
      }
    }
  }
  else {
    bashHashStart(local_268,pubkey_len * 2);
    bashHashStepH(der,(size_t)poVar11,local_268);
    bashHashStepG(poVar10,uVar12,local_268);
    oid = "1.2.112.0.2.0.34.101.77.13";
    if (pubkey_len == 0x60) {
      oid = "1.2.112.0.2.0.34.101.77.12";
    }
    eVar4 = bignOidToDER((octet *)PubKey,(size_t *)CertHAT,oid);
    if (eVar4 == 0) {
LAB_0013bd3d:
      eVar4 = bignPubkeyVal((bign_params *)CertBody,pubkey);
      local_268 = poVar10;
      if (eVar4 == 0) {
        eVar4 = bignVerify((bign_params *)CertBody,(octet *)PubKey,(size_t)CertHAT[0].der,poVar10,
                           local_240,pubkey);
      }
    }
  }
  blobClose(local_268);
  if (eVar4 != 0) {
    return eVar4;
  }
LAB_0013bb6e:
  sVar7 = derTSEQDecStop(poVar9,CVCert);
  if (sVar7 == 0xffffffffffffffff) {
    return 0x132;
  }
  if (sVar5 == sVar7 + sVar6) {
    eVar4 = btokCVCCheck(cvc);
    return eVar4;
  }
  return 0x132;
}

Assistant:

err_t btokCVCUnwrap(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t t;
	const octet* body;
	size_t body_len;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		pubkey_len != 0 && pubkey_len != 48 &&
			pubkey_len != 64 && pubkey_len != 96 &&	pubkey_len != 128 ||
		pubkey_len == 0 && pubkey != 0 && pubkey != cvc->pubkey ||
		!memIsValid(cert, cert_len) ||
		!memIsValid(pubkey, pubkey_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), cert, cert_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// подготовить cvc
	memSetZero(cvc, sizeof(btok_cvc_t));
	// начать декодирование...
	t = derTSEQDecStart(CVCert, cert, cert_len, 0x7F21);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...декодировать основную часть...
	t = btokCVCBodyDec(cvc, cert, cert_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	body = cert, body_len = t;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...определить длину подписи...
	if (pubkey_len == 0 && pubkey == cvc->pubkey)
		pubkey_len = cvc->pubkey_len;
	if (pubkey_len == 0)
	{
		size_t sig_len;
		if (derDec3(0, cert, cert_len, 0x5F37, sig_len = 34) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 48) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 72) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 96) == SIZE_MAX)
			return ERR_BAD_FORMAT;
		cvc->sig_len = sig_len;
	}
	else
		cvc->sig_len = pubkey_len == 48 ? 34 : pubkey_len - pubkey_len / 4;
	// ...декодировать подпись...
	t = derTOCTDec2(cvc->sig, cert, cert_len, 0x5F37, cvc->sig_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...проверить подпись...
	if (pubkey_len)
	{
		code = btokVerify(body, body_len, cvc->sig, pubkey, pubkey_len);
		ERR_CALL_CHECK(code);
	}
	// ...завершить декодирование
	t = derTSEQDecStop(cert, CVCert);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	if (cert_len != 0)
		return ERR_BAD_FORMAT;
	// окончательная проверка cvc
	return btokCVCCheck(cvc);
}